

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::SetHomeDirectory(cmake *this,string *dir)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  cmState::SetSourceDirectory(this->State,dir);
  bVar1 = cmStateSnapshot::IsValid(&this->CurrentSnapshot);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_38,"CMAKE_SOURCE_DIR",&local_39);
    cmStateSnapshot::SetDefinition(&this->CurrentSnapshot,&local_38,dir);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void cmake::SetHomeDirectory(const std::string& dir)
{
  this->State->SetSourceDirectory(dir);
  if (this->CurrentSnapshot.IsValid()) {
    this->CurrentSnapshot.SetDefinition("CMAKE_SOURCE_DIR", dir);
  }
}